

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O2

uint * fetchTransformedBilinearARGB32PM<(TextureBlendType)4>
                 (uint *buffer,Operator *param_2,QSpanData *data,int y,int x,int length)

{
  uint *puVar1;
  double dVar2;
  uchar *puVar3;
  undefined8 uVar4;
  double dVar5;
  double dVar6;
  bool bVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  long lVar13;
  uint *puVar14;
  uint *puVar15;
  uint uVar16;
  ulong uVar17;
  long lVar18;
  uchar *in_R10;
  long lVar19;
  long in_FS_OFFSET;
  ulong uVar20;
  int iVar21;
  double dVar22;
  int iVar25;
  double dVar23;
  undefined1 auVar24 [16];
  int iVar26;
  double dVar27;
  undefined1 auVar28 [16];
  double dVar29;
  uint uVar30;
  uint uVar32;
  double dVar31;
  uint uVar33;
  int iVar34;
  uint local_78;
  uint local_40;
  uint local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  dVar22 = (double)x + 0.5;
  dVar27 = (double)y + 0.5;
  uVar17 = (ulong)length;
  puVar1 = buffer + uVar17;
  bVar7 = canUseFastMatrixPath(dVar22,dVar27,uVar17,data);
  if (!bVar7) {
    dVar2 = data->m13;
    dVar5 = data->m11;
    dVar6 = data->m12;
    dVar29 = dVar27 * data->m23 + dVar22 * dVar2 + data->m33;
    dVar31 = data->dx + dVar27 * data->m21 + dVar22 * dVar5;
    dVar22 = data->dy + dVar27 * data->m22 + dVar22 * dVar6;
    for (puVar14 = buffer; puVar14 < puVar1; puVar14 = puVar14 + 1) {
      dVar27 = (double)(-(ulong)(dVar29 == 0.0) & 0x3ff0000000000000 |
                       ~-(ulong)(dVar29 == 0.0) & (ulong)(1.0 / dVar29));
      dVar23 = dVar27 * dVar31 + -0.5;
      dVar27 = dVar27 * dVar22 + -0.5;
      iVar25 = (int)dVar23 - (uint)(dVar23 < 0.0);
      iVar10 = (int)dVar27 - (uint)(dVar27 < 0.0);
      uVar4 = *(undefined8 *)((long)&data->field_23 + 0x18);
      iVar9 = (int)uVar4 + -1;
      iVar12 = (int)((ulong)uVar4 >> 0x20) + -1;
      iVar34 = iVar9;
      if (iVar25 < iVar9) {
        iVar34 = iVar25;
      }
      auVar24._0_4_ = -(uint)(iVar25 < iVar9);
      auVar24._4_4_ = auVar24._0_4_;
      auVar24._8_4_ = -(uint)(iVar10 < iVar12);
      auVar24._12_4_ = -(uint)(iVar10 < iVar12);
      uVar30 = movmskpd((int)in_R10,auVar24);
      iVar21 = iVar25 + 1;
      if ((uVar30 & 1) == 0) {
        iVar21 = iVar9;
      }
      iVar9 = (data->field_23).texture.x1;
      if (iVar25 < iVar9) {
        iVar21 = iVar9;
        iVar34 = iVar9;
      }
      iVar9 = iVar12;
      if (iVar10 < iVar12) {
        iVar9 = iVar10;
      }
      if ((uVar30 & 2) != 0) {
        iVar12 = iVar10 + 1;
      }
      iVar11 = (data->field_23).texture.y1;
      if (iVar10 < iVar11) {
        iVar12 = iVar11;
        iVar9 = iVar11;
      }
      puVar3 = (data->field_23).texture.imageData;
      lVar19 = (data->field_23).texture.bytesPerLine;
      in_R10 = puVar3 + iVar9 * lVar19;
      lVar19 = iVar12 * lVar19;
      uVar8 = interpolate_4_pixels
                        (*(uint *)(in_R10 + (long)iVar34 * 4),*(uint *)(in_R10 + (long)iVar21 * 4),
                         *(uint *)(puVar3 + (long)iVar34 * 4 + lVar19),
                         *(uint *)(puVar3 + (long)iVar21 * 4 + lVar19),
                         (int)((dVar23 - (double)iVar25) * 256.0),
                         (int)((dVar27 - (double)iVar10) * 256.0));
      *puVar14 = uVar8;
      dVar31 = dVar31 + dVar5;
      dVar22 = dVar22 + dVar6;
      dVar29 = dVar29 + dVar2;
      dVar29 = (double)((ulong)dVar29 & -(ulong)(dVar29 != 0.0) |
                       ~-(ulong)(dVar29 != 0.0) & (ulong)(dVar2 + dVar29));
    }
    goto LAB_005aca46;
  }
  dVar2 = data->m11;
  dVar29 = data->m22;
  uVar33 = (uint)(dVar2 * 65536.0);
  iVar34 = (int)(data->m12 * 65536.0);
  uVar30 = (int)((dVar27 * data->m21 + dVar22 * dVar2 + data->dx) * 65536.0) - 0x8000;
  uVar32 = (int)((dVar27 * dVar29 + dVar22 * data->m12 + data->dy) * 65536.0) - 0x8000;
  local_40 = uVar32;
  local_3c = uVar30;
  if (iVar34 != 0) {
    uVar20 = -(ulong)(dVar2 < -dVar2);
    if (((double)(~uVar20 & (ulong)dVar2 | (ulong)-dVar2 & uVar20) < 0.125) ||
       (uVar20 = -(ulong)(dVar29 < -dVar29),
       (double)(~uVar20 & (ulong)dVar29 | (ulong)-dVar29 & uVar20) < 0.125)) {
      puVar3 = (data->field_23).texture.imageData;
      lVar19 = (data->field_23).texture.bytesPerLine;
      for (puVar14 = buffer; local_40 = uVar32, local_3c = uVar30, puVar14 < puVar1;
          puVar14 = puVar14 + 1) {
        iVar21 = (int)uVar30 >> 0x10;
        iVar25 = (int)uVar32 >> 0x10;
        iVar10 = (data->field_23).texture.x2 + -1;
        iVar12 = iVar21 + 1;
        iVar9 = iVar21;
        if (iVar10 <= iVar21) {
          iVar12 = iVar10;
          iVar9 = iVar10;
        }
        iVar11 = (data->field_23).texture.y2 + -1;
        uVar4 = *(undefined8 *)((long)&data->field_23 + 0x10);
        iVar26 = (int)uVar4;
        iVar10 = (int)((ulong)uVar4 >> 0x20);
        auVar28._0_4_ = -(uint)(iVar21 < iVar26);
        auVar28._4_4_ = auVar28._0_4_;
        auVar28._8_4_ = -(uint)(iVar25 < iVar10);
        auVar28._12_4_ = -(uint)(iVar25 < iVar10);
        uVar16 = movmskpd((int)uVar17,auVar28);
        if ((uVar16 & 1) != 0) {
          iVar12 = iVar26;
          iVar9 = iVar26;
        }
        iVar21 = iVar25 + 1;
        if (iVar11 <= iVar25) {
          iVar21 = iVar11;
          iVar25 = iVar11;
        }
        if ((uVar16 & 2) != 0) {
          iVar21 = iVar10;
          iVar25 = iVar10;
        }
        lVar13 = iVar25 * lVar19;
        lVar18 = iVar21 * lVar19;
        uVar17 = (ulong)*(uint *)(puVar3 + (long)iVar9 * 4 + lVar13);
        uVar8 = interpolate_4_pixels
                          (*(uint *)(puVar3 + (long)iVar9 * 4 + lVar13),
                           *(uint *)(puVar3 + (long)iVar12 * 4 + lVar13),
                           *(uint *)(puVar3 + (long)iVar9 * 4 + lVar18),
                           *(uint *)(puVar3 + (long)iVar12 * 4 + lVar18),uVar30 >> 8 & 0xff,
                           uVar32 >> 8 & 0xff);
        *puVar14 = uVar8;
        uVar30 = uVar30 + uVar33;
        uVar32 = uVar32 + iVar34;
      }
    }
    else {
      (*(code *)_ZL35bilinearFastTransformHelperARGB32PM_4)
                (buffer,puVar1,&data->field_23,&local_3c,&local_40,uVar33,iVar34);
    }
    goto LAB_005aca46;
  }
  uVar17 = (ulong)uVar33;
  uVar16 = -uVar33;
  if (0 < (int)uVar33) {
    uVar16 = uVar33;
  }
  puVar14 = buffer;
  if (0x10000 < uVar16) {
    if (0x20000 < uVar16) {
      uVar20 = -(ulong)(dVar29 < -dVar29);
      if (0.125 <= (double)(~uVar20 & (ulong)dVar29 | (ulong)-dVar29 & uVar20)) {
        (*(code *)_ZL35bilinearFastTransformHelperARGB32PM_2)
                  (buffer,puVar1,&data->field_23,&local_3c,&local_40,uVar17,0);
        goto LAB_005aca46;
      }
      iVar25 = (int)uVar32 >> 0x10;
      iVar34 = (data->field_23).texture.y1;
      iVar12 = (data->field_23).texture.y2 + -1;
      iVar9 = iVar12;
      if (iVar25 < iVar12) {
        iVar12 = iVar25;
        iVar9 = iVar25 + 1;
      }
      if (iVar25 < iVar34) {
        iVar9 = iVar34;
        iVar12 = iVar34;
      }
      puVar3 = (data->field_23).texture.imageData;
      lVar19 = (data->field_23).texture.bytesPerLine;
      lVar13 = iVar12 * lVar19;
      lVar19 = iVar9 * lVar19;
      iVar34 = (data->field_23).texture.x1;
      iVar12 = (data->field_23).texture.x2;
      local_78 = uVar32 >> 8 & 0xff;
      uVar20 = (ulong)(int)uVar30;
      for (; puVar14 < puVar1; puVar14 = puVar14 + 1) {
        iVar25 = (int)uVar20 >> 0x10;
        iVar9 = (data->field_23).texture.x1;
        if ((iVar9 <= iVar25) && (iVar9 = (data->field_23).texture.x2 + -1, iVar25 < iVar9)) break;
        uVar8 = INTERPOLATE_PIXEL_256
                          (*(uint *)(puVar3 + (long)iVar9 * 4 + lVar13),0x100 - (uVar32 >> 8 & 0xff)
                           ,*(uint *)(puVar3 + (long)iVar9 * 4 + lVar19),local_78);
        *puVar14 = uVar8;
        local_3c = uVar33 + (int)uVar20;
        uVar20 = uVar20 + (long)(int)uVar33;
      }
      if ((int)uVar33 < 1) {
        puVar15 = puVar1;
        if ((int)uVar33 < 0) {
          lVar18 = (long)((long)iVar34 * 0x10000 - uVar20) / (long)(int)uVar33;
          goto LAB_005aca7e;
        }
      }
      else {
        lVar18 = (long)((long)(iVar12 + -1) * 0x10000 - uVar20) / (long)uVar17;
LAB_005aca7e:
        puVar15 = puVar14 + lVar18;
        if (puVar1 < puVar14 + lVar18) {
          puVar15 = puVar1;
        }
      }
      for (; uVar30 = (uint)uVar20, puVar14 < puVar15; puVar14 = puVar14 + 1) {
        uVar8 = interpolate_4_pixels
                          ((uint *)(puVar3 + (long)((int)uVar30 >> 0x10) * 4 + lVar13),
                           (uint *)(puVar3 + (long)((int)uVar30 >> 0x10) * 4 + lVar19),
                           (uint)(byte)(uVar20 >> 8),local_78);
        *puVar14 = uVar8;
        uVar20 = (ulong)(uVar30 + uVar33);
      }
      for (; local_3c = uVar30, uVar30 = uVar33 + local_3c, puVar14 < puVar1; puVar14 = puVar14 + 1)
      {
        iVar25 = (int)uVar20 >> 0x10;
        iVar34 = (data->field_23).texture.x1;
        iVar12 = (data->field_23).texture.x2 + -1;
        iVar9 = iVar12;
        if (iVar25 < iVar12) {
          iVar12 = iVar25;
          iVar9 = iVar25 + 1;
        }
        if (iVar25 < iVar34) {
          iVar9 = iVar34;
          iVar12 = iVar34;
        }
        uVar8 = interpolate_4_pixels
                          (*(uint *)(puVar3 + (long)iVar12 * 4 + lVar13),
                           *(uint *)(puVar3 + (long)iVar9 * 4 + lVar13),
                           *(uint *)(puVar3 + (long)iVar12 * 4 + lVar19),
                           *(uint *)(puVar3 + (long)iVar9 * 4 + lVar19),(uint)(byte)(uVar20 >> 8),
                           local_78);
        *puVar14 = uVar8;
        uVar20 = (ulong)((int)uVar20 + uVar33);
      }
      goto LAB_005aca46;
    }
    uVar30 = length + 1U >> 1;
    if (length < 0x400) {
      uVar30 = length;
    }
    (*(code *)_ZL35bilinearFastTransformHelperARGB32PM_0)
              (buffer,buffer + (int)uVar30,&data->field_23,&local_3c,&local_40,uVar17,0);
    puVar14 = buffer + (int)uVar30;
    if (uVar30 == length) goto LAB_005aca46;
  }
  (*(code *)_ZL35bilinearFastTransformHelperARGB32PM_0)
            (puVar14,puVar1,&data->field_23,&local_3c,&local_40,uVar17,0);
LAB_005aca46:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return buffer;
  }
  __stack_chk_fail();
}

Assistant:

static const uint * QT_FASTCALL fetchTransformedBilinearARGB32PM(uint *buffer, const Operator *,
                                                                 const QSpanData *data, int y, int x,
                                                                 int length)
{
    const qreal cx = x + qreal(0.5);
    const qreal cy = y + qreal(0.5);
    constexpr int tiled = (blendType == BlendTransformedBilinearTiled) ? 1 : 0;

    uint *end = buffer + length;
    uint *b = buffer;
    if (canUseFastMatrixPath(cx, cy, length, data)) {
        // The increment pr x in the scanline
        int fdx = (int)(data->m11 * fixed_scale);
        int fdy = (int)(data->m12 * fixed_scale);

        int fx = int((data->m21 * cy
                      + data->m11 * cx + data->dx) * fixed_scale);
        int fy = int((data->m22 * cy
                      + data->m12 * cx + data->dy) * fixed_scale);

        fx -= half_point;
        fy -= half_point;

        if (fdy == 0) { // simple scale, no rotation or shear
            if (qAbs(fdx) <= fixed_scale) {
                // simple scale up on X
                bilinearFastTransformHelperARGB32PM[tiled][SimpleScaleTransform](b, end, data->texture, fx, fy, fdx, fdy);
            } else if (qAbs(fdx) <= 2 * fixed_scale) {
                // simple scale down on X, less than 2x
                const int mid = (length * 2 < BufferSize) ? length : ((length + 1) / 2);
                bilinearFastTransformHelperARGB32PM[tiled][SimpleScaleTransform](buffer, buffer + mid, data->texture, fx, fy, fdx, fdy);
                if (mid != length)
                    bilinearFastTransformHelperARGB32PM[tiled][SimpleScaleTransform](buffer + mid, buffer + length, data->texture, fx, fy, fdx, fdy);
            } else if (qAbs(data->m22) < qreal(1./8.)) {
                // scale up more than 8x (on Y)
                bilinearFastTransformHelperARGB32PM[tiled][UpscaleTransform](b, end, data->texture, fx, fy, fdx, fdy);
            } else {
                // scale down on X
                bilinearFastTransformHelperARGB32PM[tiled][DownscaleTransform](b, end, data->texture, fx, fy, fdx, fdy);
            }
        } else { // rotation or shear
            if (qAbs(data->m11) < qreal(1./8.) || qAbs(data->m22) < qreal(1./8.) ) {
                // if we are zooming more than 8 times, we use 8bit precision for the position.
                bilinearFastTransformHelperARGB32PM[tiled][RotateTransform](b, end, data->texture, fx, fy, fdx, fdy);
            } else {
                // we are zooming less than 8x, use 4bit precision
                bilinearFastTransformHelperARGB32PM[tiled][FastRotateTransform](b, end, data->texture, fx, fy, fdx, fdy);
            }
        }
    } else {
        const QTextureData &image = data->texture;

        const qreal fdx = data->m11;
        const qreal fdy = data->m12;
        const qreal fdw = data->m13;

        qreal fx = data->m21 * cy + data->m11 * cx + data->dx;
        qreal fy = data->m22 * cy + data->m12 * cx + data->dy;
        qreal fw = data->m23 * cy + data->m13 * cx + data->m33;

        while (b < end) {
            const qreal iw = fw == 0 ? 1 : 1 / fw;
            const qreal px = fx * iw - qreal(0.5);
            const qreal py = fy * iw - qreal(0.5);

            int x1 = int(px) - (px < 0);
            int x2;
            int y1 = int(py) - (py < 0);
            int y2;

            int distx = int((px - x1) * 256);
            int disty = int((py - y1) * 256);

            fetchTransformedBilinear_pixelBounds<blendType>(image.width, image.x1, image.x2 - 1, x1, x2);
            fetchTransformedBilinear_pixelBounds<blendType>(image.height, image.y1, image.y2 - 1, y1, y2);

            const uint *s1 = (const uint *)data->texture.scanLine(y1);
            const uint *s2 = (const uint *)data->texture.scanLine(y2);

            uint tl = s1[x1];
            uint tr = s1[x2];
            uint bl = s2[x1];
            uint br = s2[x2];

            *b = interpolate_4_pixels(tl, tr, bl, br, distx, disty);

            fx += fdx;
            fy += fdy;
            fw += fdw;
            //force increment to avoid /0
            if (!fw) {
                fw += fdw;
            }
            ++b;
        }
    }

    return buffer;
}